

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_block.h
# Opt level: O0

StringBlock * google::protobuf::internal::StringBlock::Emplace(void *p,size_t n,StringBlock *next)

{
  StringBlock *next_00;
  size_type size;
  size_t sVar1;
  char *failure_msg;
  LogMessage *pLVar2;
  unsigned_short *puVar3;
  size_type local_7a;
  size_type local_6a;
  size_type local_68;
  unsigned_short local_66 [3];
  size_type next_size;
  size_type doubled;
  LogMessage local_58;
  Voidify local_41;
  unsigned_long local_40;
  unsigned_short local_32;
  Nullable<const_char_*> local_30;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  StringBlock *pSStack_20;
  size_type count;
  StringBlock *next_local;
  size_t n_local;
  void *p_local;
  
  absl_log_internal_check_op_result._6_2_ = (unsigned_short)n;
  pSStack_20 = next;
  next_local = (StringBlock *)n;
  n_local = (size_t)p;
  local_32 = absl::lts_20250127::log_internal::GetReferenceableValue
                       (absl_log_internal_check_op_result._6_2_);
  sVar1 = NextSize(pSStack_20);
  local_40 = absl::lts_20250127::log_internal::GetReferenceableValue(sVar1);
  local_30 = absl::lts_20250127::log_internal::Check_EQImpl<unsigned_short,unsigned_long>
                       (&local_32,&local_40,"count == NextSize(next)");
  if (local_30 != (Nullable<const_char_*>)0x0) {
    failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_30);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_58,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/string_block.h"
               ,0x7d,failure_msg);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_58);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_41,pLVar2);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_58);
  }
  local_66[0] = absl_log_internal_check_op_result._6_2_ << 1;
  if (pSStack_20 == (StringBlock *)0x0) {
    local_7a = min_size();
  }
  else {
    local_6a = max_size();
    puVar3 = std::min<unsigned_short>(local_66,&local_6a);
    local_7a = *puVar3;
  }
  sVar1 = n_local;
  next_00 = pSStack_20;
  local_68 = local_7a;
  size = RoundedSize(absl_log_internal_check_op_result._6_2_);
  StringBlock((StringBlock *)sVar1,next_00,false,size,local_68);
  return (StringBlock *)sVar1;
}

Assistant:

inline StringBlock* StringBlock::Emplace(void* p, size_t n, StringBlock* next) {
  const auto count = static_cast<size_type>(n);
  ABSL_DCHECK_EQ(count, NextSize(next));
  size_type doubled = count * 2;
  size_type next_size = next ? std::min(doubled, max_size()) : min_size();
  return new (p) StringBlock(next, false, RoundedSize(count), next_size);
}